

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracer.h
# Opt level: O1

void __thiscall dynamicgraph::Tracer::~Tracer(Tracer *this)

{
  Tracer *pTVar1;
  Tracer *pTVar2;
  
  *(code **)this = std::__cxx11::ostringstream::~ostringstream;
  (*__Unwind_Resume)();
  SignalTimeDependent<int,_int>::~SignalTimeDependent
            ((SignalTimeDependent<int,_int> *)(this + 0x1c8));
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(this + 0x1a8));
  pTVar2 = *(Tracer **)(this + 400);
  while (pTVar2 != this + 400) {
    pTVar1 = *(Tracer **)pTVar2;
    operator_delete(pTVar2,0x18);
    pTVar2 = pTVar1;
  }
  if (*(Tracer **)(this + 0x168) != this + 0x178) {
    operator_delete(*(Tracer **)(this + 0x168),*(long *)(this + 0x178) + 1);
  }
  if (*(Tracer **)(this + 0x148) != this + 0x158) {
    operator_delete(*(Tracer **)(this + 0x148),*(long *)(this + 0x158) + 1);
  }
  if (*(Tracer **)(this + 0x128) != this + 0x138) {
    operator_delete(*(Tracer **)(this + 0x128),*(long *)(this + 0x138) + 1);
  }
  pTVar2 = *(Tracer **)(this + 0xd8);
  while (pTVar2 != this + 0xd8) {
    pTVar1 = *(Tracer **)pTVar2;
    operator_delete(pTVar2,0x18);
    pTVar2 = pTVar1;
  }
  dynamicgraph::Entity::~Entity((Entity *)this);
  return;
}

Assistant:

virtual ~Tracer() { closeFiles(); }